

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_StartingBlockSize_Test::TestBody(ArenaTest_StartingBlockSize_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertHelper local_1a8;
  AssertionResult gtest_ar_2;
  AssertHelper local_190;
  ArenaOptions options;
  Arena custom_arena;
  Arena default_arena;
  
  internal::ThreadSafeArena::ThreadSafeArena(&default_arena.impl_);
  gtest_ar_2._0_8_ = (ulong)(uint)gtest_ar_2._4_4_ << 0x20;
  options.start_block_size = internal::ThreadSafeArena::SpaceAllocated(&default_arena.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&custom_arena,"0","default_arena.SpaceAllocated()",(int *)&gtest_ar_2,
             &options.start_block_size);
  if ((char)custom_arena.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&options);
    if (custom_arena.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)custom_arena.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6a7,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&options);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (options.start_block_size != 0) {
      (**(code **)(*(long *)options.start_block_size + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&custom_arena.impl_.alloc_policy_);
  Arena::CreateArray<char>(&default_arena,1);
  options.start_block_size = 0x100;
  options.max_block_size = 0x8000;
  options.initial_block = (char *)0x0;
  options.initial_block_size = 0;
  options.block_alloc = (_func_void_ptr_size_t *)0x0;
  options.block_dealloc = (_func_void_void_ptr_size_t *)0x0;
  gtest_ar_2._0_8_ = internal::ThreadSafeArena::SpaceAllocated(&default_arena.impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&custom_arena,"default_arena.SpaceAllocated()","options.start_block_size",
             (unsigned_long *)&gtest_ar_2,&options.start_block_size);
  if ((char)custom_arena.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (custom_arena.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)custom_arena.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6ad,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&custom_arena.impl_.alloc_policy_);
  options.start_block_size = options.start_block_size << 1;
  Arena::Arena(&custom_arena,&options);
  Arena::CreateArray<char>(&custom_arena,1);
  local_1a8.data_ =
       (AssertHelperData *)internal::ThreadSafeArena::SpaceAllocated(&custom_arena.impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_2,"custom_arena.SpaceAllocated()","options.start_block_size",
             (unsigned_long *)&local_1a8,&options.start_block_size);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_1a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6b3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_1a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1a8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  internal::ThreadSafeArena::~ThreadSafeArena(&custom_arena.impl_);
  internal::ThreadSafeArena::~ThreadSafeArena(&default_arena.impl_);
  return;
}

Assistant:

TEST(ArenaTest, StartingBlockSize) {
  Arena default_arena;
  EXPECT_EQ(0, default_arena.SpaceAllocated());

  // Allocate something to get starting block size.
  Arena::CreateArray<char>(&default_arena, 1);
  ArenaOptions options;
  // First block size should be the default starting block size.
  EXPECT_EQ(default_arena.SpaceAllocated(), options.start_block_size);

  // Use a custom starting block size.
  options.start_block_size *= 2;
  Arena custom_arena(options);
  Arena::CreateArray<char>(&custom_arena, 1);
  EXPECT_EQ(custom_arena.SpaceAllocated(), options.start_block_size);
}